

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O0

void __thiscall dynet::AdagradTrainer::alloc_impl(AdagradTrainer *this)

{
  ParameterCollection *in_stack_00000008;
  vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>
  *in_stack_ffffffffffffffc8;
  vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>
  *in_stack_ffffffffffffffd0;
  
  allocate_shadow_parameters(in_stack_00000008);
  std::vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>::operator=
            ((vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_> *)
             in_stack_ffffffffffffffd0,
             (vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_> *)
             in_stack_ffffffffffffffc8);
  std::vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>::~vector
            ((vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_> *)
             in_stack_ffffffffffffffd0);
  allocate_shadow_lookup_parameters(in_stack_00000008);
  std::vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>::
  operator=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>::
  ~vector(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void AdagradTrainer::alloc_impl() {
  vp = allocate_shadow_parameters(*model);
  vlp = allocate_shadow_lookup_parameters(*model);
}